

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeRTASBuilderBuildExt
          (ze_rtas_builder_ext_handle_t hBuilder,
          ze_rtas_builder_build_op_ext_desc_t *pBuildOpDescriptor,void *pScratchBuffer,
          size_t scratchBufferSizeBytes,void *pRtasBuffer,size_t rtasBufferSizeBytes,
          ze_rtas_parallel_operation_ext_handle_t hParallelOperation,void *pBuildUserPtr,
          ze_rtas_aabb_ext_t *pBounds,size_t *pRtasBufferSizeBytes)

{
  undefined8 local_70;
  ze_pfnRTASBuilderBuildExt_t pfnBuildExt;
  dditable_t *dditable;
  ze_result_t result;
  size_t rtasBufferSizeBytes_local;
  void *pRtasBuffer_local;
  size_t scratchBufferSizeBytes_local;
  void *pScratchBuffer_local;
  ze_rtas_builder_build_op_ext_desc_t *pBuildOpDescriptor_local;
  ze_rtas_builder_ext_handle_t hBuilder_local;
  
  if (*(code **)(*(long *)(hBuilder + 8) + 0x10) == (code *)0x0) {
    hBuilder_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    if (hParallelOperation == (ze_rtas_parallel_operation_ext_handle_t)0x0) {
      local_70 = 0;
    }
    else {
      local_70 = *(undefined8 *)hParallelOperation;
    }
    hBuilder_local._4_4_ =
         (**(code **)(*(long *)(hBuilder + 8) + 0x10))
                   (*(undefined8 *)hBuilder,pBuildOpDescriptor,pScratchBuffer,scratchBufferSizeBytes
                    ,pRtasBuffer,rtasBufferSizeBytes,local_70,pBuildUserPtr,pBounds,
                    pRtasBufferSizeBytes);
  }
  return hBuilder_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASBuilderBuildExt(
        ze_rtas_builder_ext_handle_t hBuilder,          ///< [in] handle of builder object
        const ze_rtas_builder_build_op_ext_desc_t* pBuildOpDescriptor,  ///< [in] pointer to build operation descriptor
        void* pScratchBuffer,                           ///< [in][range(0, `scratchBufferSizeBytes`)] scratch buffer to be used
                                                        ///< during acceleration structure construction
        size_t scratchBufferSizeBytes,                  ///< [in] size of scratch buffer, in bytes
        void* pRtasBuffer,                              ///< [in] pointer to destination buffer
        size_t rtasBufferSizeBytes,                     ///< [in] destination buffer size, in bytes
        ze_rtas_parallel_operation_ext_handle_t hParallelOperation, ///< [in][optional] handle to parallel operation object
        void* pBuildUserPtr,                            ///< [in][optional] pointer passed to callbacks
        ze_rtas_aabb_ext_t* pBounds,                    ///< [in,out][optional] pointer to destination address for acceleration
                                                        ///< structure bounds
        size_t* pRtasBufferSizeBytes                    ///< [out][optional] updated acceleration structure size requirement, in
                                                        ///< bytes
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_rtas_builder_ext_object_t*>( hBuilder )->dditable;
        auto pfnBuildExt = dditable->ze.RTASBuilder.pfnBuildExt;
        if( nullptr == pfnBuildExt )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hBuilder = reinterpret_cast<ze_rtas_builder_ext_object_t*>( hBuilder )->handle;

        // convert loader handle to driver handle
        hParallelOperation = ( hParallelOperation ) ? reinterpret_cast<ze_rtas_parallel_operation_ext_object_t*>( hParallelOperation )->handle : nullptr;

        // forward to device-driver
        result = pfnBuildExt( hBuilder, pBuildOpDescriptor, pScratchBuffer, scratchBufferSizeBytes, pRtasBuffer, rtasBufferSizeBytes, hParallelOperation, pBuildUserPtr, pBounds, pRtasBufferSizeBytes );

        return result;
    }